

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void wasm::PrintExpressionContents::handleResumeTable<wasm::Resume>(ostream *o,Resume *curr)

{
  Resume *o_00;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  Name *pNVar4;
  IString *this;
  string_view local_30;
  uint local_1c;
  Resume *pRStack_18;
  Index i;
  Resume *curr_local;
  ostream *o_local;
  
  local_1c = 0;
  pRStack_18 = curr;
  curr_local = (Resume *)o;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                      (&(pRStack_18->handlerTags).
                        super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>);
    if (sVar3 <= uVar2) break;
    std::operator<<((ostream *)curr_local," (");
    o_00 = curr_local;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"on ");
    printMedium((ostream *)o_00,local_30);
    pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(pRStack_18->handlerTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)local_1c)
    ;
    wasm::Name::print(pNVar4,(ostream *)curr_local);
    std::operator<<((ostream *)curr_local,' ');
    this = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                      (&(pRStack_18->handlerBlocks).
                        super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)local_1c)
            ->super_IString;
    bVar1 = IString::isNull(this);
    if (bVar1) {
      std::operator<<((ostream *)curr_local,"switch");
    }
    else {
      pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(pRStack_18->handlerBlocks).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)local_1c);
      wasm::Name::print(pNVar4,(ostream *)curr_local);
    }
    std::operator<<((ostream *)curr_local,')');
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

static void handleResumeTable(std::ostream& o, ResumeType* curr) {
    static_assert(std::is_base_of<ResumeType, Resume>::value ||
                  std::is_base_of<ResumeType, ResumeThrow>::value);
    for (Index i = 0; i < curr->handlerTags.size(); i++) {
      o << " (";
      printMedium(o, "on ");
      curr->handlerTags[i].print(o);
      o << ' ';
      if (curr->handlerBlocks[i].isNull()) {
        o << "switch";
      } else {
        curr->handlerBlocks[i].print(o);
      }
      o << ')';
    }
  }